

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_aggregate_optimizer.cpp
# Opt level: O0

void __thiscall
duckdb::CommonAggregateOptimizer::ExtractCommonAggregates
          (CommonAggregateOptimizer *this,LogicalAggregate *aggr)

{
  idx_t table;
  bool bVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar2;
  reference idx;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  long in_RSI;
  ColumnBinding new_binding_1;
  ColumnBinding original_binding_1;
  ColumnBinding new_binding;
  ColumnBinding original_binding;
  iterator entry;
  idx_t original_index;
  idx_t i;
  idx_t total_erased;
  expression_map_t<idx_t> aggregate_remap;
  Expression *in_stack_fffffffffffffeb8;
  mapped_type *in_stack_fffffffffffffec0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  ColumnBinding local_d0;
  ColumnBinding local_c0;
  ColumnBinding local_b0;
  ColumnBinding local_a0;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
  local_88 [4];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
  local_68;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_58;
  long local_50;
  long local_10;
  
  local_10 = in_RSI;
  ::std::
  unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
                   *)0xcfa1e1);
  local_50 = 0;
  local_58 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)0x0;
  while (this_00 = local_58,
        pvVar2 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            *)(local_10 + 0x28)), this_00 < pvVar2) {
    local_60 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)((long)&(local_58->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_50);
    idx = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffec0);
    ::std::reference_wrapper<duckdb::Expression>::
    reference_wrapper<duckdb::Expression&,void,duckdb::Expression*>
              ((reference_wrapper<duckdb::Expression> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8);
    local_68._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
         ::find((unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffeb8,(key_type *)0xcfa29d);
    local_88[0]._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
         ::end((unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
                *)in_stack_fffffffffffffeb8);
    bVar1 = ::std::__detail::operator==(&local_68,local_88);
    pvVar2 = local_58;
    if (bVar1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffec0);
      ::std::reference_wrapper<duckdb::Expression>::
      reference_wrapper<duckdb::Expression&,void,duckdb::Expression*>
                ((reference_wrapper<duckdb::Expression> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      pmVar3 = ::std::
               unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
               ::operator[]((unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
      *pmVar3 = (mapped_type)pvVar2;
      if (local_58 != local_60) {
        ColumnBinding::ColumnBinding(&local_a0,*(idx_t *)(local_10 + 0x70),(idx_t)local_60);
        ColumnBinding::ColumnBinding(&local_b0,*(idx_t *)(local_10 + 0x70),(idx_t)local_58);
        pmVar4 = ::std::
                 unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
                 ::operator[]((unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
                               *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
        pmVar4->table_index = local_b0.table_index;
        pmVar4->column_index = local_b0.column_index;
      }
    }
    else {
      local_50 = local_50 + 1;
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::erase_at(this_00,(idx_t)idx);
      local_58 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)((long)&local_58[-1].
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      ColumnBinding::ColumnBinding(&local_c0,*(idx_t *)(local_10 + 0x70),(idx_t)local_60);
      table = *(idx_t *)(local_10 + 0x70);
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_false,_true>
                             *)0xcfa49b);
      ColumnBinding::ColumnBinding(&local_d0,table,ppVar5->second);
      in_stack_fffffffffffffec0 =
           ::std::
           unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
           ::operator[]((unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
                         *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffec0->table_index = local_d0.table_index;
      in_stack_fffffffffffffec0->column_index = local_d0.column_index;
    }
    local_58 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)((long)&(local_58->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  ::std::
  unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<std::reference_wrapper<duckdb::Expression>,_unsigned_long,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>_>
                    *)0xcfa50e);
  return;
}

Assistant:

void CommonAggregateOptimizer::ExtractCommonAggregates(LogicalAggregate &aggr) {
	expression_map_t<idx_t> aggregate_remap;
	idx_t total_erased = 0;
	for (idx_t i = 0; i < aggr.expressions.size(); i++) {
		idx_t original_index = i + total_erased;
		auto entry = aggregate_remap.find(*aggr.expressions[i]);
		if (entry == aggregate_remap.end()) {
			// aggregate does not exist yet: add it to the map
			aggregate_remap[*aggr.expressions[i]] = i;
			if (i != original_index) {
				// this aggregate is not erased, however an aggregate BEFORE it has been erased
				// so we need to remap this aggregate
				ColumnBinding original_binding(aggr.aggregate_index, original_index);
				ColumnBinding new_binding(aggr.aggregate_index, i);
				aggregate_map[original_binding] = new_binding;
			}
		} else {
			// aggregate already exists! we can remove this entry
			total_erased++;
			aggr.expressions.erase_at(i);
			i--;
			// we need to remap any references to this aggregate so they point to the other aggregate
			ColumnBinding original_binding(aggr.aggregate_index, original_index);
			ColumnBinding new_binding(aggr.aggregate_index, entry->second);
			aggregate_map[original_binding] = new_binding;
		}
	}
}